

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O0

void __thiscall QNetworkAccessCache::updateTimer(QNetworkAccessCache *this)

{
  QObject *in_RDI;
  QBasicTimer *unaff_retaddr;
  qint64 interval;
  int in_stack_0000001c;
  QObject *obj;
  
  obj = in_RDI;
  QBasicTimer::stop();
  if (*(long *)(in_RDI + 0x18) != 0) {
    QDeadlineTimer::remainingTime();
    QBasicTimer::start(unaff_retaddr,in_stack_0000001c,obj);
  }
  return;
}

Assistant:

void QNetworkAccessCache::updateTimer()
{
    timer.stop();

    if (!firstExpiringNode)
        return;

    qint64 interval = firstExpiringNode->timer.remainingTime();
    if (interval <= 0) {
        interval = 0;
    }

    // Plus 10 msec so we don't spam timer events if date comparisons are too fuzzy.
    // This code used to do (broken) rounding, but for ConnectionCacheExpiryTimeoutSecondsAttribute
    // to work we cannot do this.
    // See discussion in https://codereview.qt-project.org/c/qt/qtbase/+/337464
    timer.start(interval + 10, this);
}